

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::Texture3DLodControlCase::init
          (Texture3DLodControlCase *this,EVP_PKEY_CTX *ctx)

{
  uint width;
  uint height;
  uint depth;
  pointer pPVar1;
  int i;
  int extraout_EAX;
  Texture3D *this_00;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  deUint32 step;
  Vector<float,_4> res;
  TextureFormatInfo fmtInfo;
  uint local_b0;
  float local_a8 [4];
  Vec4 local_98;
  TextureFormat local_88;
  RGBA local_80 [4];
  TextureFormatInfo local_70;
  
  local_88 = glu::mapGLInternalFormat(0x8058);
  tcu::getTextureFormatInfo(&local_70,&local_88);
  width = this->m_texWidth;
  height = this->m_texHeight;
  uVar3 = height;
  if ((int)height < (int)width) {
    uVar3 = width;
  }
  depth = this->m_texDepth;
  if ((int)uVar3 <= (int)depth) {
    uVar3 = depth;
  }
  if (uVar3 == 0) {
    local_b0 = 0x20;
  }
  else {
    local_b0 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> local_b0 == 0; local_b0 = local_b0 - 1) {
      }
    }
    local_b0 = local_b0 ^ 0x1f;
  }
  this_00 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,0x8058,width,height,depth);
  this->m_texture = this_00;
  if (uVar3 != 0) {
    iVar5 = 0x1f - local_b0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    uVar4 = 0;
    do {
      tcu::Texture3D::allocLevel(&this->m_texture->m_refTexture,(int)uVar4);
      pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      tcu::RGBA::toVec(local_80);
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      local_a8[3] = 0.0;
      lVar2 = 0;
      do {
        local_a8[lVar2] = (float)local_80[lVar2].m_value * local_70.lookupScale.m_data[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      local_98.m_data[0] = 0.0;
      local_98.m_data[1] = 0.0;
      local_98.m_data[2] = 0.0;
      local_98.m_data[3] = 0.0;
      lVar2 = 0;
      do {
        local_98.m_data[lVar2] = local_a8[lVar2] + local_70.lookupBias.m_data[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      tcu::clear(pPVar1 + uVar4,&local_98);
      uVar4 = uVar4 + 1;
    } while (uVar4 != iVar5 + 1);
  }
  glu::Texture3D::upload(this->m_texture);
  return extraout_EAX;
}

Assistant:

void Texture3DLodControlCase::init (void)
{
	const deUint32					format			= GL_RGBA8;
	const tcu::TextureFormat&		texFmt			= glu::mapGLInternalFormat(format);
	tcu::TextureFormatInfo			fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::Vec4&				cScale			= fmtInfo.lookupScale;
	const tcu::Vec4&				cBias			= fmtInfo.lookupBias;
	int								numLevels		= deLog2Floor32(de::max(de::max(m_texWidth, m_texHeight), m_texDepth))+1;

	m_texture = new glu::Texture3D(m_context.getRenderContext(), format, m_texWidth, m_texHeight, m_texDepth);

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec()*cScale + cBias);
	}

	m_texture->upload();
}